

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring64_bitmap_flip_closed_inplace(roaring64_bitmap_t *r,uint64_t min,uint64_t max)

{
  ushort uVar1;
  ulong uVar2;
  ulong in_RDX;
  ulong in_RSI;
  uint8_t *in_RDI;
  uint32_t max_container;
  uint32_t min_container;
  uint8_t current_high48_key [6];
  uint64_t high48_bits;
  uint64_t max_high48_bits;
  uint64_t min_high48_bits;
  uint16_t max_low16;
  uint16_t min_low16;
  int in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  uint64_t in_stack_ffffffffffffffc0;
  undefined8 local_38;
  
  if (in_RSI <= in_RDX) {
    uVar1 = (ushort)in_RSI;
    uVar2 = in_RSI >> 0x10;
    for (local_38 = uVar2; local_38 <= in_RDX >> 0x10; local_38 = local_38 + 1) {
      split_key(in_stack_ffffffffffffffc0,
                (uint8_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      in_stack_ffffffffffffffbc = 0;
      if (local_38 == uVar2) {
        in_stack_ffffffffffffffbc = (uint)uVar1;
      }
      in_stack_ffffffffffffffb8 = 0x10000;
      if (local_38 == in_RDX >> 0x10) {
        in_stack_ffffffffffffffb8 = (ushort)in_RDX + 1;
      }
      roaring64_flip_leaf_inplace(_max_container,in_RDI,(uint32_t)(in_RSI >> 0x20),(uint32_t)in_RSI)
      ;
    }
  }
  return;
}

Assistant:

void roaring64_bitmap_flip_closed_inplace(roaring64_bitmap_t *r, uint64_t min,
                                          uint64_t max) {
    if (min > max) {
        return;
    }
    uint16_t min_low16 = (uint16_t)min;
    uint16_t max_low16 = (uint16_t)max;
    uint64_t min_high48_bits = (min & 0xFFFFFFFFFFFF0000ULL) >> 16;
    uint64_t max_high48_bits = (max & 0xFFFFFFFFFFFF0000ULL) >> 16;

    // Flip the range (including non-existent containers!) between min and
    // max.
    for (uint64_t high48_bits = min_high48_bits; high48_bits <= max_high48_bits;
         high48_bits++) {
        uint8_t current_high48_key[ART_KEY_BYTES];
        split_key(high48_bits << 16, current_high48_key);

        uint32_t min_container = 0;
        if (high48_bits == min_high48_bits) {
            min_container = min_low16;
        }
        uint32_t max_container = 0xFFFF + 1;  // Exclusive range.
        if (high48_bits == max_high48_bits) {
            max_container = max_low16 + 1;  // Exclusive.
        }

        roaring64_flip_leaf_inplace(r, current_high48_key, min_container,
                                    max_container);
    }
}